

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

string * __thiscall
BayesianGameBase::SoftPrintSummary_abi_cxx11_(string *__return_storage_ptr__,BayesianGameBase *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Bayesian game with ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," agents");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(local_190,"Number of actions ");
  PrintTools::SoftPrintVector<unsigned_long>(&local_1c0,&this->_m_nrActions);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," joint actions)");
  std::operator<<(local_190,"\nNumber of types ");
  PrintTools::SoftPrintVector<unsigned_long>(&local_1c0,&this->_m_nrTypes);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," joint types)");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameBase::SoftPrintSummary() const
{
    stringstream ss;
    ss << "Bayesian game with "<<_m_nrAgents<<" agents"<<endl;
    ss << "Number of actions ";
    ss << SoftPrintVector(_m_nrActions);
    ss << " ("<< _m_nrJA <<" joint actions)";
    ss << "\nNumber of types ";
    ss << SoftPrintVector(_m_nrTypes);
    ss << " ("<< _m_nrJTypes <<" joint types)"<<endl;
    return(ss.str());
}